

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
despot::VNode::VNode(VNode *this,int count,double value,int depth,QNode *parent,OBS_TYPE edge)

{
  OBS_TYPE edge_local;
  QNode *parent_local;
  int depth_local;
  double value_local;
  int count_local;
  VNode *this_local;
  
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&this->particles_);
  this->belief_ = (Belief *)0x0;
  this->depth_ = depth;
  this->parent_ = parent;
  this->edge_ = edge;
  std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::vector(&this->children_);
  ValuedAction::ValuedAction(&this->default_move_);
  this->count_ = count;
  this->value_ = value;
  return;
}

Assistant:

VNode::VNode(int count, double value, int depth, QNode* parent, OBS_TYPE edge) :
	belief_(NULL),
	depth_(depth),
	parent_(parent),
	edge_(edge),
	count_(count),
	value_(value) {
}